

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *pZVar1;
  ZSTD_CDict *pZVar2;
  ZSTD_CDict *pZVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (cctx != (ZSTD_CCtx *)0x0) {
    pZVar1 = (ZSTD_CCtx *)(cctx->workspace).workspace;
    lVar5 = 0x1480;
    if (pZVar1 == cctx) {
      lVar5 = 0;
    }
    sVar4 = (cctx->localDict).dictSize;
    pZVar2 = (cctx->localDict).cdict;
    lVar6 = 0;
    if (pZVar2 != (ZSTD_CDict *)0x0) {
      pZVar3 = (ZSTD_CDict *)(pZVar2->workspace).workspace;
      lVar7 = (long)(pZVar2->workspace).workspaceEnd - (long)pZVar3;
      lVar6 = lVar7 + 0x17c0;
      if (pZVar3 == pZVar2) {
        lVar6 = lVar7;
      }
    }
    if ((cctx->localDict).dictBuffer == (void *)0x0) {
      sVar4 = 0;
    }
    return (long)(cctx->workspace).workspaceEnd + sVar4 + lVar6 + (lVar5 - (long)pZVar1);
  }
  return 0;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}